

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls.c
# Opt level: O2

int cvNlsConvTest(SUNNonlinearSolver NLS,N_Vector ycor,N_Vector delta,sunrealtype tol,N_Vector ewt,
                 void *cvode_mem)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int m;
  double local_38;
  sunrealtype local_30;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x139,"cvNlsConvTest",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    local_30 = tol;
    local_38 = (double)N_VWrmsNorm(delta,ewt);
    iVar1 = SUNNonlinSolGetCurIter(NLS,&m);
    if (iVar1 == 0) {
      dVar3 = *(double *)((long)cvode_mem + 0x540);
      if (0 < m) {
        dVar3 = dVar3 * 0.3;
        dVar2 = local_38 / *(double *)((long)cvode_mem + 0x550);
        if (dVar3 <= dVar2) {
          dVar3 = dVar2;
        }
        *(double *)((long)cvode_mem + 0x540) = dVar3;
      }
      dVar2 = 1.0;
      if (dVar3 <= 1.0) {
        dVar2 = dVar3;
      }
      if ((dVar2 * local_38) / local_30 <= 1.0) {
        if (m != 0) {
          local_38 = (double)N_VWrmsNorm(ycor,ewt);
        }
        *(double *)((long)cvode_mem + 0x558) = local_38;
        *(undefined4 *)((long)cvode_mem + 0x560) = 1;
        iVar1 = 0;
      }
      else if ((m < 1) ||
              (iVar1 = 0x386,
              local_38 <=
              *(double *)((long)cvode_mem + 0x550) + *(double *)((long)cvode_mem + 0x550))) {
        *(double *)((long)cvode_mem + 0x550) = local_38;
        iVar1 = 0x385;
      }
    }
    else {
      iVar1 = -0x15;
    }
  }
  return iVar1;
}

Assistant:

static int cvNlsConvTest(SUNNonlinearSolver NLS, N_Vector ycor, N_Vector delta,
                         sunrealtype tol, N_Vector ewt, void* cvode_mem)
{
  CVodeMem cv_mem;
  int m, retval;
  sunrealtype del;
  sunrealtype dcon;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* compute the norm of the correction */
  del = N_VWrmsNorm(delta, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != CV_SUCCESS) { return (CV_MEM_NULL); }

  /* Test for convergence. If m > 0, an estimate of the convergence
     rate constant is stored in crate, and used in the test.        */
  if (m > 0)
  {
    cv_mem->cv_crate = SUNMAX(CRDOWN * cv_mem->cv_crate, del / cv_mem->cv_delp);
  }
  dcon = del * SUNMIN(ONE, cv_mem->cv_crate) / tol;

  if (dcon <= ONE)
  {
    cv_mem->cv_acnrm    = (m == 0) ? del : N_VWrmsNorm(ycor, ewt);
    cv_mem->cv_acnrmcur = SUNTRUE;
    return (CV_SUCCESS); /* Nonlinear system was solved successfully */
  }

  /* check if the iteration seems to be diverging */
  if ((m >= 1) && (del > RDIV * cv_mem->cv_delp))
  {
    return (SUN_NLS_CONV_RECVR);
  }

  /* Save norm of correction and loop again */
  cv_mem->cv_delp = del;

  /* Not yet converged */
  return (SUN_NLS_CONTINUE);
}